

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_77::AsyncPipe::BlockedPumpTo::write
          (BlockedPumpTo *this,int __fd,void *__buf,size_t __n)

{
  TransformPromiseNodeBase *this_00;
  undefined4 in_register_00000034;
  _func_int **pp_Var1;
  PromiseNode *pPVar2;
  Own<kj::_::ChainPromiseNode> OVar3;
  Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_>_> OVar4;
  Fault f;
  Promise<void> local_78;
  Own<kj::_::PromiseNode> local_68;
  Own<kj::_::PromiseNode> local_58;
  Fault local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pp_Var1 = (_func_int **)CONCAT44(in_register_00000034,__fd);
  if (pp_Var1[7] == (_func_int *)0x0) {
    pPVar2 = (PromiseNode *)(pp_Var1[5] + -(long)pp_Var1[6]);
    if (__n <= (PromiseNode *)(pp_Var1[5] + -(long)pp_Var1[6])) {
      pPVar2 = (PromiseNode *)__n;
    }
    (*(code *)**(undefined8 **)pp_Var1[4])(&local_68,pp_Var1[4],__buf,pPVar2);
    this_00 = (TransformPromiseNodeBase *)operator_new(0x48);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_68,
               kj::_::
               TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:810:17),_kj::_::PropagateException>
               ::anon_class_32_4_aebd93b5_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0062a1c0;
    this_00[1].super_PromiseNode._vptr_PromiseNode = pp_Var1;
    this_00[1].dependency.disposer = (Disposer *)__n;
    this_00[1].dependency.ptr = pPVar2;
    this_00[1].continuationTracePtr = __buf;
    local_58.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(void_const*,unsigned_long)::{lambda()#1},kj::_::PropagateException>>
          ::instance;
    local_58.ptr = (PromiseNode *)this_00;
    OVar3 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_48,&local_58);
    pPVar2 = local_58.ptr;
    local_78.super_PromiseBase.node.disposer._0_4_ = local_48.exception._0_4_;
    local_78.super_PromiseBase.node.disposer._4_4_ = local_48.exception._4_4_;
    local_78.super_PromiseBase.node.ptr = (PromiseNode *)CONCAT44(uStack_3c,uStack_40);
    if ((TransformPromiseNodeBase *)local_58.ptr != (TransformPromiseNodeBase *)0x0) {
      local_58.ptr = (PromiseNode *)0x0;
      (**(local_58.disposer)->_vptr_Disposer)
                (local_58.disposer,
                 ((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode,OVar3.ptr);
    }
    OVar4 = heap<kj::_::AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>>,kj::Canceler&,kj::Promise<void>>
                      ((kj *)&local_48,(Canceler *)(pp_Var1 + 7),&local_78);
    pPVar2 = local_78.super_PromiseBase.node.ptr;
    *(undefined4 *)&(this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
         local_48.exception._0_4_;
    *(undefined4 *)
     ((long)&(this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream + 4) =
         local_48.exception._4_4_;
    *(undefined4 *)&(this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream =
         uStack_40;
    *(undefined4 *)
     ((long)&(this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream + 4) =
         uStack_3c;
    if (local_78.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
      local_78.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (*(code *)**(undefined8 **)
                  CONCAT44(local_78.super_PromiseBase.node.disposer._4_4_,
                           local_78.super_PromiseBase.node.disposer._0_4_))
                ((undefined8 *)
                 CONCAT44(local_78.super_PromiseBase.node.disposer._4_4_,
                          local_78.super_PromiseBase.node.disposer._0_4_),
                 pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode,OVar4.ptr);
    }
    pPVar2 = local_68.ptr;
    if (local_68.ptr != (PromiseNode *)0x0) {
      local_68.ptr = (PromiseNode *)0x0;
      (**(local_68.disposer)->_vptr_Disposer)
                (local_68.disposer,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode)
      ;
    }
    return (ssize_t)this;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
            (&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
             ,0x326,FAILED,"canceler.isEmpty()","\"already pumping\"",
             (char (*) [16])"already pumping");
  kj::_::Debug::Fault::fatal(&local_48);
}

Assistant:

KJ_IF_MAYBE(reason, stoppage) {
        if (reason->is<Eof>()) {
          return uint64_t(0);
        }
        return cp(reason->get<Exception>());
      }